

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void sample_top_k(vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                  *logits_id,int top_k)

{
  iterator __new_size;
  iterator iVar1;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  _Var2;
  undefined4 in_ESI;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
  *in_stack_ffffffffffffffc8;
  difference_type in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff0;
  
  __new_size = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                         (in_stack_ffffffffffffffc8);
  iVar1 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                    (in_stack_ffffffffffffffc8);
  _Var2 = __gnu_cxx::
          __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
          ::operator+(iVar1._M_current,in_stack_ffffffffffffffd0);
  iVar1 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
                    (in_stack_ffffffffffffffc8);
  std::
  partial_sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,sample_top_k(std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>&,int)::__0>
            (__new_size._M_current,_Var2._M_current,iVar1._M_current);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffff0),(size_type)__new_size._M_current);
  return;
}

Assistant:

void sample_top_k(std::vector<std::pair<double, gpt_vocab::id>> & logits_id, int top_k) {
    // find the top K tokens
    std::partial_sort(
            logits_id.begin(),
            logits_id.begin() + top_k, logits_id.end(),
            [](const std::pair<double, gpt_vocab::id> & a, const std::pair<double, gpt_vocab::id> & b) {
        return a.first > b.first;
    });

    logits_id.resize(top_k);
}